

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.h
# Opt level: O0

int __thiscall google::protobuf::UnknownFieldSet::SpaceUsedExcludingSelf(UnknownFieldSet *this)

{
  int iVar1;
  size_t size;
  UnknownFieldSet *this_local;
  
  size = SpaceUsedExcludingSelfLong(this);
  iVar1 = internal::ToIntSize(size);
  return iVar1;
}

Assistant:

int SpaceUsedExcludingSelf() const {
    return internal::ToIntSize(SpaceUsedExcludingSelfLong());
  }